

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestResultTest.cpp
# Opt level: O1

void __thiscall TEST_GROUP_CppUTestGroupTestResult::setup(TEST_GROUP_CppUTestGroupTestResult *this)

{
  StringBufferTestOutput *this_00;
  TestResult *this_01;
  
  this_00 = (StringBufferTestOutput *)
            operator_new(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestResultTest.cpp"
                         ,0x32);
  StringBufferTestOutput::StringBufferTestOutput(this_00);
  this->mock = this_00;
  this->printer = (TestOutput *)this_00;
  this_01 = (TestResult *)
            operator_new(0x70,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestResultTest.cpp"
                         ,0x34);
  TestResult::TestResult(this_01,this->printer);
  this->res = this_01;
  CppUTestStore(&GetPlatformSpecificTimeInMillis);
  GetPlatformSpecificTimeInMillis = MockGetPlatformSpecificTimeInMillis;
  return;
}

Assistant:

void setup() _override
    {
        mock = new StringBufferTestOutput();
        printer = mock;
        res = new TestResult(*printer);
        UT_PTR_SET(GetPlatformSpecificTimeInMillis, MockGetPlatformSpecificTimeInMillis);
    }